

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,StringTree *params_10,
          ArrayPtr<const_char> *params_11,StringTree *params_12,ArrayPtr<const_char> *params_13,
          ArrayPtr<const_char> *params_14,ArrayPtr<const_char> *params_15,
          ArrayPtr<const_char> *params_16,ArrayPtr<const_char> *params_17,
          ArrayPtr<const_char> *params_18,ArrayPtr<const_char> *params_19,
          ArrayPtr<const_char> *params_20,ArrayPtr<const_char> *params_21,
          ArrayPtr<const_char> *params_22,CappedArray<char,_26UL> *params_23,
          ArrayPtr<const_char> *params_24,CappedArray<char,_26UL> *params_25,
          ArrayPtr<const_char> *params_26)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  char *__n;
  Branch *pBVar4;
  size_t sVar5;
  long lVar6;
  size_t result_2;
  char *pcVar7;
  String local_1b0;
  char *local_198;
  size_t sStack_190;
  size_t local_188;
  size_t sStack_180;
  char *local_178;
  char *local_170;
  size_t sStack_168;
  size_t local_160;
  size_t sStack_158;
  size_t local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  size_t sStack_128;
  size_t local_120;
  size_t sStack_118;
  size_t local_110;
  size_t sStack_108;
  size_t local_100;
  size_t sStack_f8;
  size_t local_f0;
  size_t sStack_e8;
  char *local_e0;
  undefined8 uStack_d8;
  char *local_d0;
  undefined8 uStack_c8;
  StringTree *local_b8;
  ArrayPtr<const_char> *local_b0;
  ArrayPtr<const_char> *local_a8;
  ArrayPtr<const_char> *local_a0;
  StringTree *local_98;
  size_t local_90;
  char *local_88;
  char *local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_38 = (this->text).content.ptr;
  local_198 = local_38;
  local_40 = params->size_;
  sStack_190 = local_40;
  local_48 = params_1->size_;
  local_188 = local_48;
  local_50 = params_2->size_;
  sStack_180 = local_50;
  local_178 = params_3->ptr;
  local_58 = (params_4->text).content.ptr;
  local_170 = local_58;
  local_60 = params_5->size_;
  sStack_168 = local_60;
  local_68 = params_6->size_;
  local_160 = local_68;
  local_70 = params_7->size_;
  sStack_158 = local_70;
  local_78 = params_8->size_;
  local_150 = local_78;
  local_148 = params_9->ptr;
  local_80 = (params_10->text).content.ptr;
  local_140 = local_80;
  local_138 = params_11->ptr;
  local_88 = (params_12->text).content.ptr;
  local_130 = local_88;
  local_90 = params_13->size_;
  sStack_128 = local_90;
  local_120 = params_14->size_;
  sStack_118 = params_15->size_;
  local_110 = params_16->size_;
  sStack_108 = params_17->size_;
  local_100 = params_18->size_;
  sStack_f8 = params_19->size_;
  local_f0 = params_20->size_;
  sStack_e8 = params_21->size_;
  local_e0 = params_22->ptr;
  uStack_d8 = *(undefined8 *)params_23->content;
  local_d0 = params_24->ptr;
  uStack_c8 = *(undefined8 *)params_25->content;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_198 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xd8);
  __return_storage_ptr__->size_ = sVar5;
  sVar5 = 0;
  local_178 = (char *)0x0;
  local_148 = (char *)0x0;
  local_138 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_198 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xd8);
  local_b8 = this;
  local_b0 = params;
  local_a8 = params_1;
  local_a0 = params_2;
  local_98 = (StringTree *)params_3;
  heapString(&local_1b0,sVar5);
  pcVar7 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar7 != (char *)0x0) {
    sVar5 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar7,1,sVar5,sVar5,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_1b0.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_1b0.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_1b0.content.disposer;
  local_188 = 0;
  sStack_180 = 0;
  local_198 = (char *)0x0;
  sStack_190 = 0;
  local_178 = (char *)0x1;
  local_170 = (char *)0x0;
  sStack_168 = 0;
  local_160 = 0;
  sStack_158 = 0;
  sVar5 = 0;
  local_150 = 0;
  local_148 = (char *)0x1;
  local_140 = (char *)0x0;
  local_138 = (char *)0x1;
  local_130 = (char *)0x0;
  sStack_128 = 0;
  local_120 = 0;
  sStack_118 = 0;
  local_110 = 0;
  sStack_108 = 0;
  local_100 = 0;
  sStack_f8 = 0;
  local_f0 = 0;
  sStack_e8 = 0;
  local_e0 = (char *)0x0;
  uStack_d8 = 0;
  local_d0 = (char *)0x0;
  uStack_c8 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_198 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xd8);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_1b0.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_1b0.content.ptr = (char *)pBVar4;
  local_1b0.content.size_ = sVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar7 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar7 != (char *)0x0) {
    pcVar7 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (local_b8->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar7,(void *)local_b8->size_,(size_t)__n);
    pcVar7 = pcVar7 + (long)__n;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar7,0,local_b0,local_a8,local_a0,local_98,
             (ArrayPtr<const_char> *)params_4,params_5,params_6,params_7,params_8,
             (StringTree *)params_9,(ArrayPtr<const_char> *)params_10,(StringTree *)params_11,
             (ArrayPtr<const_char> *)params_12,params_13,params_14,params_15,params_16,params_17,
             params_18,params_19,params_20,params_21,(CappedArray<char,_26UL> *)params_22,
             (ArrayPtr<const_char> *)params_23,(CappedArray<char,_26UL> *)params_24,
             (ArrayPtr<const_char> *)params_25);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}